

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

void __thiscall
iutest::AssertionHelper::ScopedTrace::append_message
          (ScopedTrace *this,TestPartResult *part_result,bool isException)

{
  iuCodeMessage *piVar1;
  bool bVar2;
  reference ppSVar3;
  char *__s;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  _Self local_68;
  iterator end;
  iterator it;
  allocator<char> local_41;
  string local_40;
  byte local_19;
  iuCodeMessage *piStack_18;
  bool isException_local;
  TestPartResult *part_result_local;
  ScopedTrace *this_local;
  
  local_19 = isException;
  piStack_18 = &part_result->super_iuCodeMessage;
  part_result_local = (TestPartResult *)this;
  bVar2 = std::__cxx11::
          list<iutest::AssertionHelper::ScopedMessage_*,_std::allocator<iutest::AssertionHelper::ScopedMessage_*>_>
          ::empty(&this->list);
  if ((!bVar2) || (bVar2 = detail::UncaughtScopedTrace::Has(), bVar2)) {
    piVar1 = piStack_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"\niutest trace:",&local_41);
    detail::iuCodeMessage::add_message(piVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    end = std::__cxx11::
          list<iutest::AssertionHelper::ScopedMessage_*,_std::allocator<iutest::AssertionHelper::ScopedMessage_*>_>
          ::begin(&this->list);
    local_68._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<iutest::AssertionHelper::ScopedMessage_*,_std::allocator<iutest::AssertionHelper::ScopedMessage_*>_>
         ::end(&this->list);
    while (bVar2 = std::operator!=(&end,&local_68), piVar1 = piStack_18, bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"\n",&local_89);
      detail::iuCodeMessage::add_message(piVar1,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator(&local_89);
      piVar1 = piStack_18;
      ppSVar3 = std::_List_iterator<iutest::AssertionHelper::ScopedMessage_*>::operator*(&end);
      detail::iuCodeMessage::make_message_abi_cxx11_(&local_d0,(iuCodeMessage *)*ppSVar3);
      __s = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,__s,&local_d1);
      detail::iuCodeMessage::add_message(piVar1,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator(&local_d1);
      std::__cxx11::string::~string((string *)&local_d0);
      std::_List_iterator<iutest::AssertionHelper::ScopedMessage_*>::operator++(&end);
    }
    if ((local_19 & 1) != 0) {
      detail::UncaughtScopedTrace::Get_abi_cxx11_();
      detail::iuCodeMessage::add_message(piVar1,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
    }
  }
  return;
}

Assistant:

void append_message(TestPartResult& part_result, bool isException)
        {
            if( !list.empty() || detail::UncaughtScopedTrace::Has() )
            {
                part_result.add_message("\niutest trace:");
                // TODO : 追加メッセージとして保存するべき
                // 現状はテスト結果のメッセージに追加している。
                for( msg_list::iterator it = list.begin(), end=list.end(); it != end; ++it )
                {
                    part_result.add_message("\n");
                    part_result.add_message((*it)->make_message().c_str());
                }
                if( isException )
                {
                    part_result.add_message(detail::UncaughtScopedTrace::Get());
                }
            }
        }